

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

wchar_t dungeon_get_next_level(player *p,wchar_t dlev,wchar_t added)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  
  wVar2 = (uint)z_info->stair_skip * added + dlev;
  wVar3 = (uint)z_info->max_depth + L'\xffffffff';
  if (wVar2 < (int)(uint)z_info->max_depth) {
    wVar3 = wVar2;
  }
  wVar2 = L'\0';
  if (L'\0' < wVar3) {
    wVar2 = wVar3;
  }
  while ((wVar3 = wVar2, dlev <= wVar2 && (_Var1 = is_quest(p,dlev), wVar3 = dlev, !_Var1))) {
    dlev = dlev + L'\x01';
  }
  return wVar3;
}

Assistant:

int dungeon_get_next_level(struct player *p, int dlev, int added)
{
	int target_level, i;

	/* Get target level */
	target_level = dlev + added * z_info->stair_skip;

	/* Don't allow levels below max */
	if (target_level > z_info->max_depth - 1)
		target_level = z_info->max_depth - 1;

	/* Don't allow levels above the town */
	if (target_level < 0) target_level = 0;

	/* Check intermediate levels for quests */
	for (i = dlev; i <= target_level; i++) {
		if (is_quest(p, i)) return i;
	}

	return target_level;
}